

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listReporters
          (XmlReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *param_2)

{
  bool bVar1;
  XmlWriter *pXVar2;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  ScopedElement inner;
  ReporterDescription *reporter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *__range1;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ScopedElement outerTag;
  IConfig *param_2_local;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
  *descriptions_local;
  XmlReporter *this_local;
  
  outerTag._8_8_ = param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"AvailableReporters",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml,(XmlFormatting)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  __end1 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
           begin(descriptions);
  reporter = (ReporterDescription *)
             std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
             end(descriptions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                                *)&reporter);
    if (!bVar1) break;
    inner._8_8_ = __gnu_cxx::
                  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                  ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"Reporter",&local_b9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_98,(string *)&this->m_xml,(XmlFormatting)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Name",&local_e1);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_e0,Indent);
    pXVar2 = XmlWriter::writeText(pXVar2,(string *)inner._8_8_,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Description",&local_109);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_108,Indent);
    pXVar2 = XmlWriter::writeText(pXVar2,(string *)(inner._8_8_ + 0x20),None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    __gnu_cxx::
    __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

void XmlReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &) {
        auto outerTag = m_xml.scopedElement("AvailableReporters");
        for (auto const &reporter : descriptions) {
            auto inner = m_xml.scopedElement("Reporter");
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(reporter.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Description", XmlFormatting::Indent)
                .writeText(reporter.description, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }